

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Tree::has_child(Tree *this,size_t node,size_t ch)

{
  NodeData *pNVar1;
  size_t in_RSI;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  
  pNVar1 = _p(in_stack_00000040,in_stack_00000038);
  return pNVar1->m_parent == in_RSI;
}

Assistant:

bool has_child(size_t node, size_t ch) const { return _p(ch)->m_parent == node; }